

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O1

void generate<trng::mrg2>(size_t samples,unsigned_long seed)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  mrg2 r;
  char local_41;
  mrg2 local_40;
  
  trng::mrg2::mrg2(&local_40,(parameter_type)0x45335114595605e5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::mrg2::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3510d0);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"count: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"numbit: ",8);
  iVar1 = trng::int_math::log2_ceil<int>(0x7ffffffe);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  local_41 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_41,1);
  if (samples != 0) {
    do {
      uVar4 = (long)local_40.S.r[1] * (long)local_40.P.a[1] +
              (long)local_40.P.a[0] * (long)local_40.S.r[0];
      local_40.S.r[1] = local_40.S.r[0];
      uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
      uVar4 = uVar5 - 0xfffffffe;
      if (uVar5 < 0xfffffffe) {
        uVar4 = uVar5;
      }
      local_40.S.r[0] = (int)uVar4 + -0x7fffffff;
      if (uVar4 < 0x7fffffff) {
        local_40.S.r[0] = (int)uVar4;
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_40.S.r[0]);
      local_41 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_41,1);
      samples = samples - 1;
    } while (samples != 0);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}